

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws.c
# Opt level: O3

void nn_aws_init(nn_aws *self,int src,nn_ep *ep,nn_fsm *owner)

{
  nn_fsm_init(&self->fsm,nn_aws_handler,nn_aws_shutdown,src,self,owner);
  self->state = 1;
  self->ep = ep;
  nn_usock_init(&self->usock,1,&self->fsm);
  self->listener = (nn_usock *)0x0;
  (self->listener_owner).src = -1;
  (self->listener_owner).fsm = (nn_fsm *)0x0;
  nn_sws_init(&self->sws,2,ep,&self->fsm);
  nn_fsm_event_init(&self->accepted);
  nn_fsm_event_init(&self->done);
  nn_list_item_init(&self->item);
  return;
}

Assistant:

void nn_aws_init (struct nn_aws *self, int src,
    struct nn_ep *ep, struct nn_fsm *owner)
{
    nn_fsm_init (&self->fsm, nn_aws_handler, nn_aws_shutdown,
        src, self, owner);
    self->state = NN_AWS_STATE_IDLE;
    self->ep = ep;
    nn_usock_init (&self->usock, NN_AWS_SRC_USOCK, &self->fsm);
    self->listener = NULL;
    self->listener_owner.src = -1;
    self->listener_owner.fsm = NULL;
    nn_sws_init (&self->sws, NN_AWS_SRC_SWS, ep, &self->fsm);
    nn_fsm_event_init (&self->accepted);
    nn_fsm_event_init (&self->done);
    nn_list_item_init (&self->item);
}